

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractscrollarea.cpp
# Opt level: O0

void __thiscall
QAbstractScrollAreaScrollBarContainer::addWidget
          (QAbstractScrollAreaScrollBarContainer *this,QWidget *widget,LogicalPosition position)

{
  anon_union_4_2_313b0b05_for_QSizePolicy_1 aVar1;
  uint in_EDX;
  undefined8 in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  int insertIndex;
  QSizePolicy policy;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  QAbstractScrollAreaScrollBarContainer *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffd0;
  int stretch;
  QWidget *widget_00;
  int index;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 aVar2;
  long lVar3;
  
  stretch = (int)((ulong)in_RSI >> 0x20);
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  widget_00 = in_RDI;
  aVar1.bits = (Bits)QWidget::sizePolicy((QWidget *)
                                         CONCAT44(in_stack_ffffffffffffffb4,
                                                  in_stack_ffffffffffffffb0));
  if (*(int *)&in_RDI[1].super_QPaintDevice == 2) {
    QSizePolicy::setHorizontalPolicy((QSizePolicy *)&stack0xfffffffffffffff4,Ignored);
  }
  else {
    QSizePolicy::setVerticalPolicy((QSizePolicy *)&stack0xfffffffffffffff4,Ignored);
  }
  aVar2 = aVar1;
  QWidget::setSizePolicy
            ((QWidget *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             (QSizePolicy)SUB84((ulong)in_RDI >> 0x20,0));
  QWidget::setParent((QWidget *)CONCAT44(in_EDX,in_stack_ffffffffffffffd0),in_RDI);
  if ((in_EDX & 1) == 0) {
    scrollBarLayoutIndex(in_stack_ffffffffffffffb8);
  }
  index = 0;
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x494fe6);
  QBoxLayout::insertWidget
            ((QBoxLayout *)CONCAT44(aVar2.data,aVar1.data),index,widget_00,stretch,
             (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)SUB84((ulong)lVar3 >> 0x20,0));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractScrollAreaScrollBarContainer::addWidget(QWidget *widget, LogicalPosition position)
{
    QSizePolicy policy = widget->sizePolicy();
    if (orientation == Qt::Vertical)
        policy.setHorizontalPolicy(QSizePolicy::Ignored);
    else
        policy.setVerticalPolicy(QSizePolicy::Ignored);
    widget->setSizePolicy(policy);
    widget->setParent(this);

    const int insertIndex = (position & LogicalLeft) ? 0 : scrollBarLayoutIndex() + 1;
    layout->insertWidget(insertIndex, widget);
}